

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall t_php_generator::generate_program_header(t_php_generator *this,ostream *file)

{
  ostream *poVar1;
  string local_60;
  string local_40;
  
  poVar1 = std::operator<<(file,"<?php");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  php_namespace_suffix_abi_cxx11_
            (&local_60,this,(this->super_t_oop_generator).super_t_generator.program_);
  std::__cxx11::string::~string((string *)&local_60);
  if (local_60._M_string_length != 0) {
    poVar1 = std::operator<<(file,"namespace ");
    php_namespace_suffix_abi_cxx11_
              (&local_60,this,(this->super_t_oop_generator).super_t_generator.program_);
    poVar1 = std::operator<<(poVar1,(string *)&local_60);
    poVar1 = std::operator<<(poVar1,";");
    poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_60);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_60,this);
  poVar1 = std::operator<<(file,(string *)&local_60);
  php_includes_abi_cxx11_(&local_40,this);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::operator<<(file,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_php_generator::generate_program_header(std::ostream& file) {
  file << "<?php" << endl;
  if (!php_namespace_suffix(get_program()).empty()) {
    file << "namespace " << php_namespace_suffix(get_program()) << ";" << endl
         << endl;
  }
  file << autogen_comment() << php_includes();

  file << endl;
}